

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_2>::EigenDecompositionCube
          (EigenDecompositionCube<double,_2> *this,int decompositionCount,int stateCount,
          int categoryCount,long flags)

{
  double **ppdVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  bad_alloc *this_00;
  double *pdVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  EigenDecomposition<double,_2> *in_RDI;
  long in_R8;
  int i;
  bad_alloc *in_stack_ffffffffffffffb0;
  int local_30;
  
  EigenDecomposition<double,_2>::EigenDecomposition(in_RDI,in_ESI,in_EDX,in_ECX,in_R8);
  in_RDI->_vptr_EigenDecomposition = (_func_int **)&PTR__EigenDecompositionCube_001cc998;
  ppdVar1 = (double **)malloc((long)in_RDI->kEigenDecompCount << 3);
  in_RDI->gEigenValues = ppdVar1;
  if (in_RDI->gEigenValues == (double **)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffb0);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pp_Var3 = (_func_int **)malloc((long)in_RDI->kEigenDecompCount << 3);
  in_RDI[1]._vptr_EigenDecomposition = pp_Var3;
  if (in_RDI[1]._vptr_EigenDecomposition == (_func_int **)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffb0);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_30 = 0;
  while( true ) {
    if (in_RDI->kEigenDecompCount <= local_30) {
      pdVar5 = (double *)malloc((long)in_RDI->kStateCount << 3);
      in_RDI->matrixTmp = pdVar5;
      pdVar5 = (double *)malloc((long)in_RDI->kStateCount << 3);
      in_RDI->firstDerivTmp = pdVar5;
      pdVar5 = (double *)malloc((long)in_RDI->kStateCount << 3);
      in_RDI->secondDerivTmp = pdVar5;
      return;
    }
    p_Var4 = (_func_int *)
             malloc((long)in_RDI->kStateCount * 8 * (long)in_RDI->kStateCount *
                    (long)in_RDI->kStateCount);
    in_RDI[1]._vptr_EigenDecomposition[local_30] = p_Var4;
    if (in_RDI[1]._vptr_EigenDecomposition[local_30] == (_func_int *)0x0) break;
    pdVar5 = (double *)malloc((long)in_RDI->kStateCount << 3);
    in_RDI->gEigenValues[local_30] = pdVar5;
    if (in_RDI->gEigenValues[local_30] == (double *)0x0) {
      uVar2 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_stack_ffffffffffffffb0);
      __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_30 = local_30 + 1;
  }
  this_00 = (bad_alloc *)__cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(this_00);
  __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::EigenDecompositionCube(int decompositionCount,
											         int stateCount,
											         int categoryCount,
                                                     long flags)
											         : EigenDecomposition<BEAGLE_CPU_EIGEN_GENERIC>(decompositionCount,
																				stateCount,
																				categoryCount,
                                                                                    flags) {
    gEigenValues = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gEigenValues == NULL)
        throw std::bad_alloc();

    gCMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gCMatrices == NULL)
    	throw std::bad_alloc();

    for (int i = 0; i < kEigenDecompCount; i++) {
    	gCMatrices[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount * kStateCount);
    	if (gCMatrices[i] == NULL)
    		throw std::bad_alloc();

    	gEigenValues[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
    	if (gEigenValues[i] == NULL)
    		throw std::bad_alloc();
    }

    matrixTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
}